

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O3

int open_datafile(char *filename,int oflags,int prefix)

{
  int __fd;
  char *__file;
  
  __file = fqname(filename,prefix,(uint)(prefix == 4) * 3);
  __fd = open(__file,oflags,0x1a4);
  fchmod(__fd,0x1a4);
  return __fd;
}

Assistant:

int open_datafile(const char *filename, int oflags, int prefix)
{
	int fd;
#ifdef WIN32
	oflags |= O_BINARY;
#endif

	filename = fqname(filename, prefix, prefix == TROUBLEPREFIX ? 3 : 0);
#ifdef WIN32
	fd = open(filename, oflags, S_IRUSR | S_IWUSR);
#else
	fd = open(filename, oflags, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
#endif
#ifdef UNIX
	/* bypass umask and set 0644 for real */
	fchmod(fd, 0644);
#endif
	return fd;
}